

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

solution_t *
find_solution(solution_t *__return_storage_ptr__,map_t *m,nodes_list_t *nodes,int bombs,int rounds)

{
  bool bVar1;
  reference plVar2;
  reference ppVar3;
  size_type sVar4;
  size_type sVar5;
  solution_t local_150;
  undefined1 local_138 [8];
  nodes_list_t n2;
  map_t m2;
  solution_t r;
  _List_const_iterator<std::pair<int,_int>_> local_e8;
  iterator local_e0;
  _List_const_iterator<std::pair<int,_int>_> local_d8;
  const_iterator i_1;
  nodes_list_t pt;
  flags_map_t flags;
  iterator local_80;
  _List_const_iterator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_78;
  iterator local_70;
  _List_const_iterator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_68;
  const_iterator i;
  _List_const_iterator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_58;
  const_iterator j;
  undefined1 local_48 [8];
  solution_t result;
  bool empty;
  int rounds_local;
  int bombs_local;
  nodes_list_t *nodes_local;
  map_t *m_local;
  
  std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
            ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48);
  if (((bombs == 0) &&
      (bVar1 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::empty
                         (nodes), !bVar1)) || (rounds == 0)) {
    std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
              (__return_storage_ptr__,
               (list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48);
    j._M_node._4_4_ = 1;
  }
  else {
    i._M_node = (_List_node_base *)
                std::__cxx11::
                list<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ::begin(&solutions_abi_cxx11_);
    std::
    _List_const_iterator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::_List_const_iterator(&local_58,(iterator *)&i);
    local_70._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
         ::begin(&seen_abi_cxx11_);
    std::
    _List_const_iterator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::_List_const_iterator(&local_68,&local_70);
    while( true ) {
      local_80._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ::end(&seen_abi_cxx11_);
      std::
      _List_const_iterator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::_List_const_iterator(&local_78,&local_80);
      bVar1 = std::operator!=(&local_68,&local_78);
      if (!bVar1) break;
      plVar2 = std::
               _List_const_iterator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&local_68);
      bVar1 = std::operator==(plVar2,nodes);
      if (bVar1) {
        plVar2 = std::
                 _List_const_iterator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&local_58);
        std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
                  (__return_storage_ptr__,plVar2);
        j._M_node._4_4_ = 1;
        goto LAB_0011099a;
      }
      std::
      _List_const_iterator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&local_68,0);
      std::
      _List_const_iterator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&local_58,0);
    }
    build_flags_map((flags_map_t *)
                    &pt.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                     ._M_impl._M_node._M_size,m,nodes,
                    (bool *)((long)&result.
                                    super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl._M_node._M_size + 7));
    get_possible_turns_abi_cxx11_
              ((nodes_list_t *)&i_1,
               (flags_map_t *)
               &pt.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl._M_node._M_size);
    local_e0._M_node =
         (_List_node_base *)
         std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                   ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&i_1);
    std::_List_const_iterator<std::pair<int,_int>_>::_List_const_iterator(&local_d8,&local_e0);
    while( true ) {
      r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node
      ._M_size = (size_t)std::__cxx11::
                         list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                                   ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     *)&i_1);
      std::_List_const_iterator<std::pair<int,_int>_>::_List_const_iterator
                (&local_e8,
                 (iterator *)
                 &r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl._M_node._M_size);
      bVar1 = std::operator!=(&local_d8,&local_e8);
      if (!bVar1) break;
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
                ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &m2.
                  super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
      ::vector((vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                *)&n2.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl._M_node._M_size,m);
      ppVar3 = std::_List_const_iterator<std::pair<int,_int>_>::operator*(&local_d8);
      explode((map_t *)&n2.
                        super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl._M_node._M_size,ppVar3);
      get_nodes_abi_cxx11_
                ((nodes_list_t *)local_138,
                 (map_t *)&n2.
                           super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl._M_node._M_size);
      bVar1 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::empty
                        ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         local_138);
      if (bVar1) {
        ppVar3 = std::_List_const_iterator<std::pair<int,_int>_>::operator*(&local_d8);
        std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &m2.
                    super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,ppVar3);
        std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                  ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48,
                   (list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &m2.
                    super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        j._M_node._4_4_ = 5;
      }
      else {
        if ((0 < bombs + -1) && (0 < rounds + -1)) {
          find_solution(&local_150,
                        (map_t *)&n2.
                                  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl._M_node._M_size,(nodes_list_t *)local_138,bombs + -1,
                        rounds + -1);
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                    ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &m2.
                      super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_150);
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~list
                    (&local_150);
          bVar1 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  empty((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        &m2.
                         super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar1) {
            ppVar3 = std::_List_const_iterator<std::pair<int,_int>_>::operator*(&local_d8);
            std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
            push_front((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       &m2.
                        super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,ppVar3);
          }
          bVar1 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  empty((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48
                       );
          if ((bVar1) &&
             (bVar1 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ::empty((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &m2.
                               super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar1)) {
LAB_00110891:
            std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
            operator=((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48,
                      (list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      &m2.
                       super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            j._M_node._4_4_ = 5;
            goto LAB_001108b7;
          }
          bVar1 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  empty((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        &m2.
                         super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar1) {
            sVar4 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    size((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         local_48);
            sVar5 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    size((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         &m2.
                          super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (sVar5 < sVar4) goto LAB_00110891;
          }
        }
        j._M_node._4_4_ = 0;
      }
LAB_001108b7:
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~list
                ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_138);
      std::
      vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
      ::~vector((vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                 *)&n2.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl._M_node._M_size);
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~list
                ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &m2.
                  super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (j._M_node._4_4_ != 0) break;
      std::_List_const_iterator<std::pair<int,_int>_>::operator++(&local_d8,0);
    }
    std::__cxx11::
    list<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
    ::push_back(&seen_abi_cxx11_,nodes);
    std::__cxx11::
    list<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
    ::push_back(&solutions_abi_cxx11_,(value_type *)local_48);
    std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
              (__return_storage_ptr__,
               (list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48);
    j._M_node._4_4_ = 1;
    std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~list
              ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&i_1);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&pt.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl._M_node._M_size);
  }
LAB_0011099a:
  std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~list
            ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

solution_t find_solution(const map_t& m, nodes_list_t& nodes, int bombs, int rounds)
{
    bool empty;
    solution_t result;

    if ((0 == bombs && !nodes.empty())
        || 0 == rounds)
    {
        return result;
    }

    std::list<solution_t>::const_iterator j = solutions.begin();
    for (seen_t::const_iterator i = seen.begin(); i != seen.end(); i++, j++)
    {
        if (*i == nodes)
        {
            return *j;
        }
    }

    //std::cerr << "try solve: " << std::endl;
    //dump_map(m);

    flags_map_t flags = build_flags_map(m, nodes, empty);
    nodes_list_t pt = get_possible_turns(flags);
    //std::cerr << bombs << " " << std::endl;

    for (nodes_list_t::const_iterator i = pt.begin(); i != pt.end(); i++)
    {
        solution_t r;
        map_t m2 = m;
        explode(m2, *i);
        nodes_list_t n2 = get_nodes(m2);

        //std::cerr << bombs - 1 << " " << rounds - 1 << " ";
        //dump_nodes(n2);
        if (n2.empty())
        {
            r.push_back(*i);
            result = r;
            break;
        } else if (0 < bombs - 1 && 0 < rounds - 1)
        {
            r = find_solution(m2, n2, bombs - 1, rounds - 1);
            if (!r.empty())
            {
                r.push_front(*i);
            }
            if ((result.empty() && !r.empty()) || (!r.empty() && result.size() > r.size()))
            {
                result = r;
                break;
            }
        }
    }

    seen.push_back(nodes);
    solutions.push_back(result);
    return result;
}